

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_readStats_body_bmi2
                 (BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,U32 *tableLogPtr,
                 void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  size_t sVar9;
  
  sVar9 = 0xffffffffffffffb8;
  if (srcSize != 0) {
    uVar7 = (ulong)*src;
    sVar9 = 0xffffffffffffffec;
    if ((char)*src < '\0') {
      uVar5 = uVar7 - 0x7e >> 1;
      if (srcSize <= uVar5) {
        return 0xffffffffffffffb8;
      }
      uVar1 = uVar7 - 0x7f;
      if (hwSize <= uVar1) {
        return 0xffffffffffffffec;
      }
      pbVar8 = (byte *)((long)src + 1);
      for (lVar2 = 0; (uint)lVar2 < (uint)uVar1; lVar2 = lVar2 + 2) {
        huffWeight[lVar2] = *pbVar8 >> 4;
        huffWeight[lVar2 + 1] = *pbVar8 & 0xf;
        pbVar8 = pbVar8 + 1;
      }
    }
    else {
      if (srcSize <= uVar7) {
        return 0xffffffffffffffb8;
      }
      uVar1 = FSE_decompress_wksp_bmi2
                        (huffWeight,hwSize - 1,(void *)((long)src + 1),uVar7,6,workSpace,wkspSize,1)
      ;
      uVar5 = uVar7;
      if (0xffffffffffffff88 < uVar1) {
        return uVar1;
      }
    }
    rankStats[8] = 0;
    rankStats[9] = 0;
    rankStats[10] = 0;
    rankStats[0xb] = 0;
    rankStats[4] = 0;
    rankStats[5] = 0;
    rankStats[6] = 0;
    rankStats[7] = 0;
    rankStats[0xc] = 0;
    rankStats[0] = 0;
    rankStats[1] = 0;
    rankStats[2] = 0;
    rankStats[3] = 0;
    iVar3 = 0;
    for (uVar6 = 0; uVar7 = (ulong)uVar6, uVar7 < uVar1; uVar6 = uVar6 + 1) {
      if (0xc < (ulong)huffWeight[uVar7]) {
        return 0xffffffffffffffec;
      }
      rankStats[huffWeight[uVar7]] = rankStats[huffWeight[uVar7]] + 1;
      iVar3 = iVar3 + ((1 << (huffWeight[uVar7] & 0x1f)) >> 1);
    }
    if (iVar3 != 0) {
      uVar6 = LZCOUNT(iVar3) ^ 0x1f;
      if (uVar6 < 0xc) {
        *tableLogPtr = 0x20 - LZCOUNT(iVar3);
        iVar3 = (2 << (uVar6 & 0x1f)) - iVar3;
        iVar4 = LZCOUNT(iVar3);
        if (1 << ((byte)~(byte)iVar4 & 0x1f) == iVar3) {
          uVar6 = 0x20 - iVar4;
          huffWeight[uVar1] = (BYTE)uVar6;
          rankStats[uVar6] = rankStats[uVar6] + 1;
          if ((rankStats[1] & 1) == 0 && 1 < rankStats[1]) {
            *nbSymbolsPtr = (int)uVar1 + 1;
            sVar9 = uVar5 + 1;
          }
        }
      }
    }
  }
  return sVar9;
}

Assistant:

static BMI2_TARGET_ATTRIBUTE size_t HUF_readStats_body_bmi2(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize)
{
    return HUF_readStats_body(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize, 1);
}